

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O1

void __thiscall
libchess::
UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
set_option(UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,value_type *value)

{
  undefined8 uVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->value_);
  if ((this->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->handler_)._M_invoker)((_Any_data *)&this->handler_,value);
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

virtual void set_option(const value_type& value) noexcept {
        value_ = value;
        handler_(value);
    }